

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O1

EngineFactoryEntry *
adios2::core::IO::NoEngineEntry(EngineFactoryEntry *__return_storage_ptr__,string *e)

{
  pointer pcVar1;
  string local_60;
  string local_40;
  
  pcVar1 = (e->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_40,pcVar1,pcVar1 + e->_M_string_length)
  ;
  NoEngine(&__return_storage_ptr__->MakeReader,&local_40);
  pcVar1 = (e->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_60,pcVar1,pcVar1 + e->_M_string_length)
  ;
  NoEngine(&__return_storage_ptr__->MakeWriter,&local_60);
  (__return_storage_ptr__->MakeReaderWithMD).super__Function_base._M_manager = (_Manager_type)0x0;
  (__return_storage_ptr__->MakeReaderWithMD)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->MakeReaderWithMD).super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->MakeReaderWithMD).super__Function_base._M_functor + 8) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

IO::EngineFactoryEntry IO::NoEngineEntry(std::string e) { return {NoEngine(e), NoEngine(e)}; }